

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,void **vtt,
          int64_t globalsize)

{
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[4];
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow =
       globalsize;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol =
       globalsize;
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZAbstractFrontMatrix<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZFileEqnStorage<float>::TPZFileEqnStorage(&this->fStorage);
  TPZFrontNonSym<float>::TPZFrontNonSym(&this->fFront);
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fNumElConnected).fStore = (int *)0x0;
  (this->fNumElConnected).fNElements = 0;
  (this->fNumElConnected).fNAlloc = 0;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fNumElConnectedBackup).fStore = (int *)0x0;
  (this->fNumElConnectedBackup).fNElements = 0;
  (this->fNumElConnectedBackup).fNAlloc = 0;
  TPZFrontNonSym<float>::Reset(&this->fFront,globalsize);
  TPZFileEqnStorage<float>::Reset(&this->fStorage);
  TPZVec<int>::Resize(&this->fNumElConnected,0);
  TPZVec<int>::Resize(&this->fNumElConnectedBackup,0);
  this->fLastDecomposed = -1;
  this->fNumEq = globalsize;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix(int64_t globalsize) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>(globalsize,globalsize)
{
	fFront.Reset(globalsize);
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=globalsize;
}